

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpcom(fitsfile *fptr,char *comm,int *status)

{
  size_t sVar1;
  int local_90;
  int local_8c;
  int ii;
  int len;
  char card [81];
  int *status_local;
  char *comm_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    sVar1 = strlen(comm);
    local_90 = 0;
    for (local_8c = (int)sVar1; 0 < local_8c; local_8c = local_8c + -0x48) {
      strcpy((char *)&ii,"COMMENT ");
      strncat((char *)&ii,comm + local_90,0x48);
      ffprec(fptr,(char *)&ii,status);
      local_90 = local_90 + 0x48;
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpcom( fitsfile *fptr,      /* I - FITS file pointer   */
            const char  *comm,   /* I - comment string      */
            int   *status)       /* IO - error status       */
/*
  Write 1 or more COMMENT keywords.  If the comment string is too
  long to fit on a single keyword (72 chars) then it will automatically
  be continued on multiple CONTINUE keywords.
*/
{
    char card[FLEN_CARD];
    int len, ii;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    len = strlen(comm);
    ii = 0;

    for (; len > 0; len -= 72)
    {
        strcpy(card, "COMMENT ");
        strncat(card, &comm[ii], 72);
        ffprec(fptr, card, status);
        ii += 72;
    }

    return(*status);
}